

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HyperLogLogTest.cpp
# Opt level: O2

bool __thiscall TrailingZeroes_test::DoTest(TrailingZeroes_test *this)

{
  uint uVar1;
  bool bVar2;
  uint64_t fnv64;
  uint64_t i;
  ulong uVar3;
  int z;
  ulong uVar4;
  
  bVar2 = true;
  for (uVar3 = 0; (bVar2 && (uVar3 < 0x100)); uVar3 = uVar3 + 2) {
    for (uVar4 = 0; (bVar2 != false && (uVar4 < 0x20)); uVar4 = uVar4 + 1) {
      fnv64 = uVar3 * 0x101010101010101 + 0x101010101010101 << ((byte)uVar4 & 0x3f);
      uVar1 = HyperLogLog::TrailingZeroes(fnv64);
      if (uVar4 != uVar1) {
        bVar2 = false;
        TEST_LOG("NbZeroes(0x%lx) = %d instead of %d\n",fnv64,(ulong)uVar1,uVar4 & 0xffffffff);
      }
    }
  }
  return bVar2;
}

Assistant:

bool TrailingZeroes_test::DoTest()
{
    bool ret = true;

    for (uint64_t i = 0; ret && i < 256; i += 2) {
        uint64_t t64;
        uint8_t mask = (uint8_t)((i + 1) & 0xff);
        memset(&t64, mask, sizeof(t64));
        t64 |= 1;
        for (int z = 0; ret && z < 32; z++) {
            uint64_t tz = (t64 << z);
            int zv = HyperLogLog::TrailingZeroes(tz);

            if (zv != z) {
                TEST_LOG("NbZeroes(0x%" PRIx64 ") = %d instead of %d\n",
                    tz, zv, z);
                ret = false;
            }
        }
    }
    return ret;
}